

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O3

void htable_free_all_planes(HTABLE *htable)

{
  long lVar1;
  
  if (0 < htable->n_planes) {
    lVar1 = 0;
    do {
      free(htable->planes[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < htable->n_planes);
  }
  free(htable->planes);
  htable->planes = (void **)0x0;
  htable->n_planes = 0;
  return;
}

Assistant:

static void
htable_free_all_planes(HTABLE* htable)
{
    int i;

    for(i = 0; i < htable->n_planes; i++)
        free(htable->planes[i]);
    free(htable->planes);

    htable->planes = NULL;
    htable->n_planes = 0;
}